

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

int * __thiscall MeCab::ChunkFreeList<int>::alloc(ChunkFreeList<int> *this,size_t req)

{
  pointer ppVar1;
  pointer ppVar2;
  int *piVar3;
  size_t sVar4;
  int **ppiVar5;
  ulong uVar6;
  pair<unsigned_long,_int_*> local_30;
  
  ppVar1 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->freelist_).
           super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = this->li_;
  sVar4 = this->pi_;
  ppiVar5 = &ppVar1[uVar6].second;
  while( true ) {
    if ((ulong)((long)ppVar2 - (long)ppVar1 >> 4) <= uVar6) {
      uVar6 = this->default_size;
      if (this->default_size <= req) {
        uVar6 = req;
      }
      local_30.second = (int *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
      local_30.first = uVar6;
      std::vector<std::pair<unsigned_long,int*>,std::allocator<std::pair<unsigned_long,int*>>>::
      emplace_back<std::pair<unsigned_long,int*>>
                ((vector<std::pair<unsigned_long,int*>,std::allocator<std::pair<unsigned_long,int*>>>
                  *)&this->freelist_,&local_30);
      ppVar1 = (this->freelist_).
               super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar4 = ((long)(this->freelist_).
                     super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) - 1;
      this->li_ = sVar4;
      this->pi_ = this->pi_ + req;
      return ppVar1[sVar4].second;
    }
    if (sVar4 + req < ((pair<unsigned_long,_int_*> *)(ppiVar5 + -1))->first) break;
    uVar6 = uVar6 + 1;
    this->li_ = uVar6;
    this->pi_ = 0;
    ppiVar5 = ppiVar5 + 2;
    sVar4 = 0;
  }
  piVar3 = *ppiVar5;
  this->pi_ = sVar4 + req;
  return piVar3 + sVar4;
}

Assistant:

T* alloc(size_t req = 1) {
    while (li_ < freelist_.size()) {
      if ((pi_ + req) < freelist_[li_].first) {
        T *r = freelist_[li_].second + pi_;
        pi_ += req;
        return r;
      }
      li_++;
      pi_ = 0;
    }
    size_t _size = std::max(req, default_size);
    freelist_.push_back(std::make_pair(_size, new T[_size]));
    li_ = freelist_.size() - 1;
    pi_ += req;
    return freelist_[li_].second;
  }